

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retLvalue.c
# Opt level: O2

void Abc_ManCollectLatches_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLatches)

{
  int Entry;
  Abc_Ntk_t *pAVar1;
  long *plVar2;
  void **ppvVar3;
  int in_EDX;
  int Fill;
  uint uVar4;
  int iVar5;
  Vec_Int_t *p;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
    pAVar1 = pObj->pNtk;
    iVar5 = pObj->Id;
    Vec_IntFillExtra(&pAVar1->vTravIds,iVar5 + 1,in_EDX);
    if (((long)iVar5 < 0) || ((pAVar1->vTravIds).nSize <= iVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    Entry = pObj->pNtk->nTravIds;
    if ((pAVar1->vTravIds).pArray[iVar5] != Entry) {
      p = &pObj->pNtk->vTravIds;
      iVar5 = pObj->Id;
      Vec_IntFillExtra(p,iVar5 + 1,Fill);
      Vec_IntWriteEntry(p,iVar5,Entry);
      plVar2 = (long *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
      plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 5) {
        Abc_ManCollectLatches_rec
                  (*(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8),
                   vLatches);
      }
      iVar5 = vLatches->nSize;
      if (iVar5 == vLatches->nCap) {
        uVar4 = 0x10;
        if (0xf < iVar5) {
          uVar4 = iVar5 * 2;
        }
        if (iVar5 < (int)uVar4) {
          if (vLatches->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar4 << 3);
          }
          else {
            ppvVar3 = (void **)realloc(vLatches->pArray,(ulong)uVar4 << 3);
            iVar5 = vLatches->nSize;
          }
          vLatches->pArray = ppvVar3;
          vLatches->nCap = uVar4;
        }
      }
      vLatches->nSize = iVar5 + 1;
      vLatches->pArray[iVar5] = pObj;
    }
  }
  return;
}

Assistant:

void Abc_ManCollectLatches_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLatches )
{
    Abc_Obj_t * pDriver;
    if ( !Abc_ObjIsLatch(pObj) )
        return;
    // skip already collected latches
    if ( Abc_NodeIsTravIdCurrent(pObj)  )
        return;
    Abc_NodeSetTravIdCurrent(pObj);
    // get the driver node feeding into the latch
    pDriver = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
    // call recursively if the driver looks like a latch output
    if ( Abc_ObjIsBo(pDriver) )
        Abc_ManCollectLatches_rec( Abc_ObjFanin0(pDriver), vLatches );
    // collect the latch
    Vec_PtrPush( vLatches, pObj );
}